

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseTranslator.cpp
# Opt level: O0

void __thiscall InverseTranslator::InverseTranslator(InverseTranslator *this)

{
  InverseTranslator *this_local;
  
  Translator::Translator(&this->super_Translator);
  (this->super_Translator)._vptr_Translator = (_func_int **)&PTR_translate_0010cd20;
  std::__cxx11::string::string((string *)&this->vowels);
  std::__cxx11::string::operator=((string *)&this->vowels,"aeiouyAEIOUY");
  return;
}

Assistant:

InverseTranslator::InverseTranslator(){
  //vowels = {'a', 'e', 'i', 'o', 'u', 'y'}
  vowels = "aeiouyAEIOUY";
}